

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_setLogCallbackTest_Test::TestBody
          (OpenDDLParserTest_setLogCallbackTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  _func_void_LogSeverity_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **actual;
  char *pcVar3;
  AssertHelper local_378;
  Message local_370 [2];
  bad_function_call *anon_var_0_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  logCallback local_338;
  byte local_311;
  char *pcStack_310;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  AssertHelper local_2e8;
  Message local_2e0;
  logCallback local_2d8;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__1;
  Message local_2a0;
  logCallback local_298;
  undefined1 local_278 [16];
  AssertionResult gtest_ar_3;
  string local_240;
  AssertHelper local_220;
  Message local_218;
  logCallback local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_;
  Message local_1d8;
  logCallback local_1d0;
  void *local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_2;
  Message local_190;
  logCallback local_188;
  _func_void_LogSeverity_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_130;
  Message local_128 [2];
  bad_function_call *anon_var_0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  logCallback local_f0;
  byte local_c9;
  char *pcStack_c8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_b8 [3];
  logCallback local_a0;
  undefined1 local_80 [16];
  AssertionResult gtest_ar;
  OpenDDLParser myParser;
  OpenDDLParserTest_setLogCallbackTest_Test *this_local;
  
  OpenDDLParser::OpenDDLParser((OpenDDLParser *)&gtest_ar.message_);
  local_80._0_8_ = (void *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_(&local_a0,(OpenDDLParser *)&gtest_ar.message_);
  pcVar3 = (char *)0x0;
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            (local_80 + 8,"nullptr",(void **)0x1a51e5,
             (function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_80,&local_a0);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_80 + 8));
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_80 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_80 + 8));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff38,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff38);
  if (bVar1) {
    local_c9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      OpenDDLParser::getLogCallback_abi_cxx11_(&local_f0,(OpenDDLParser *)&gtest_ar.message_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"",(allocator<char> *)((long)&anon_var_0 + 7));
      std::
      function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&local_f0,ddl_info_msg,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      std::
      function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_f0);
    }
    if ((local_c9 & 1) == 0) {
      pcStack_c8 = 
      "Expected: myParser.getLogCallback()(ddl_info_msg, \"\") throws an exception of type std::bad_function_call.\n  Actual: it throws nothing."
      ;
      goto LAB_00161371;
    }
  }
  else {
LAB_00161371:
    testing::Message::Message(local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x8b,pcStack_c8);
    testing::internal::AssertHelper::operator=(&local_130,local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(local_128);
  }
  std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>::
  function<void(&)(ODDLParser::LogSeverity,std::__cxx11::string_const&),void>
            ((function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)> *)
             &gtest_ar_1.message_,OpenDDLParserTest::testLogCallback);
  OpenDDLParser::setLogCallback
            ((OpenDDLParser *)&gtest_ar.message_,(logCallback *)&gtest_ar_1.message_);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&gtest_ar_1.message_);
  local_168 = OpenDDLParserTest::testLogCallback;
  OpenDDLParser::getLogCallback_abi_cxx11_(&local_188,(OpenDDLParser *)&gtest_ar.message_);
  actual = ___std__function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>__target<void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&)>___
                     (&local_188);
  testing::internal::EqHelper<false>::
  Compare<void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&),void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&)>
            ((EqHelper<false> *)local_160,"&OpenDDLParserTest::testLogCallback",
             "*myParser.getLogCallback().target<cbType>()",&local_168,actual);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_1b0 = (void *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_(&local_1d0,(OpenDDLParser *)&gtest_ar.message_);
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            ((internal *)local_1a8,"nullptr","myParser.getLogCallback()",&local_1b0,&local_1d0);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  OpenDDLParser::getLogCallback_abi_cxx11_(&local_210,(OpenDDLParser *)&gtest_ar.message_);
  bVar1 = std::function::operator_cast_to_bool((function *)&local_210);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_1f0,bVar1);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_240,(internal *)local_1f0,(AssertionResult *)"(bool)myParser.getLogCallback()"
               ,"false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&gtest_ar_3.message_,(nullptr_t)0x0);
  OpenDDLParser::setLogCallback
            ((OpenDDLParser *)&gtest_ar.message_,(logCallback *)&gtest_ar_3.message_);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&gtest_ar_3.message_);
  local_278._0_8_ = (void *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_(&local_298,(OpenDDLParser *)&gtest_ar.message_);
  pcVar3 = (char *)0x0;
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            (local_278 + 8,"nullptr",(void **)0x1a51e5,
             (function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_278,&local_298);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_278 + 8));
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_278 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_278 + 8));
  OpenDDLParser::getLogCallback_abi_cxx11_(&local_2d8,(OpenDDLParser *)&gtest_ar.message_);
  bVar1 = std::function::operator_cast_to_bool((function *)&local_2d8);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_2b8,!bVar1);
  std::
  function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_msg_1,(internal *)local_2b8,
               (AssertionResult *)"(bool)myParser.getLogCallback()","true","false",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    std::__cxx11::string::~string((string *)&gtest_msg_1);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffcf0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffcf0);
  if (bVar1) {
    local_311 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      OpenDDLParser::getLogCallback_abi_cxx11_(&local_338,(OpenDDLParser *)&gtest_ar.message_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"",(allocator<char> *)((long)&anon_var_0_1 + 7));
      std::
      function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&local_338,ddl_info_msg,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_1 + 7));
      std::
      function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_338);
    }
    if ((local_311 & 1) != 0) goto LAB_00161f4b;
    pcStack_310 = 
    "Expected: myParser.getLogCallback()(ddl_info_msg, \"\") throws an exception of type std::bad_function_call.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_370);
  testing::internal::AssertHelper::AssertHelper
            (&local_378,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
             ,0x96,pcStack_310);
  testing::internal::AssertHelper::operator=(&local_378,local_370);
  testing::internal::AssertHelper::~AssertHelper(&local_378);
  testing::Message::~Message(local_370);
LAB_00161f4b:
  OpenDDLParser::~OpenDDLParser((OpenDDLParser *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, setLogCallbackTest) {
    OpenDDLParser myParser;
    EXPECT_EQ(nullptr, myParser.getLogCallback());
    EXPECT_THROW(myParser.getLogCallback()(ddl_info_msg, ""), std::bad_function_call);

    typedef decltype(&OpenDDLParserTest::testLogCallback) cbType;
    myParser.setLogCallback(OpenDDLParserTest::testLogCallback);
    EXPECT_EQ(&OpenDDLParserTest::testLogCallback, *myParser.getLogCallback().target<cbType>());
    EXPECT_NE(nullptr, myParser.getLogCallback());
    EXPECT_TRUE((bool)myParser.getLogCallback());

    myParser.setLogCallback(nullptr);
    EXPECT_EQ(nullptr, myParser.getLogCallback());
    EXPECT_FALSE((bool)myParser.getLogCallback());
    EXPECT_THROW(myParser.getLogCallback()(ddl_info_msg, ""), std::bad_function_call);
}